

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentHeader.cpp
# Opt level: O0

void __thiscall
Rml::DocumentHeader::MergePaths
          (DocumentHeader *this,StringList *target,StringList *source,String *source_path)

{
  undefined8 uVar1;
  size_type sVar2;
  SystemInterface *pSVar3;
  const_reference pvVar4;
  String local_120;
  String local_100;
  String local_e0;
  String local_c0;
  String local_a0;
  String local_80;
  string local_50 [8];
  String joined_path;
  size_t i;
  String *source_path_local;
  StringList *source_local;
  StringList *target_local;
  DocumentHeader *this_local;
  
  joined_path.field_2._8_8_ = 0;
  while( true ) {
    uVar1 = joined_path.field_2._8_8_;
    sVar2 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)source);
    if (sVar2 <= (ulong)uVar1) break;
    ::std::__cxx11::string::string(local_50);
    pSVar3 = GetSystemInterface();
    ::std::__cxx11::string::string((string *)&local_a0,(string *)source_path);
    StringUtilities::Replace(&local_80,&local_a0,'|',':');
    pvVar4 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)source,joined_path.field_2._8_8_);
    ::std::__cxx11::string::string((string *)&local_e0,(string *)pvVar4);
    StringUtilities::Replace(&local_c0,&local_e0,'|',':');
    (*pSVar3->_vptr_SystemInterface[4])(pSVar3,local_50,&local_80,&local_c0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::string((string *)&local_120,local_50);
    StringUtilities::Replace(&local_100,&local_120,':','|');
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)target,&local_100);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string(local_50);
    joined_path.field_2._8_8_ = joined_path.field_2._8_8_ + 1;
  }
  return;
}

Assistant:

void DocumentHeader::MergePaths(StringList& target, const StringList& source, const String& source_path)
{
	for (size_t i = 0; i < source.size(); i++)
	{
		String joined_path;
		::Rml::GetSystemInterface()->JoinPath(joined_path, StringUtilities::Replace(source_path, '|', ':'),
			StringUtilities::Replace(source[i], '|', ':'));

		target.push_back(StringUtilities::Replace(joined_path, ':', '|'));
	}
}